

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

size_t wrapped_fwrite(void *ptr,size_t size,size_t nmemb,FILE *stream)

{
  int *piVar1;
  int fd;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  curious_file_record_t *pcVar3;
  size_t sVar4;
  long local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  lVar2 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar2 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x23].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    fd = fileno((FILE *)stream);
    pcVar3 = get_curious_file_record(fd);
    if (pcVar3 == (curious_file_record_t *)0x0) {
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
    }
    else {
      local_48 = *(undefined4 *)&pcVar3->filesystem;
      uStack_44 = *(undefined4 *)((long)&pcVar3->filesystem + 4);
      uStack_40 = *(undefined4 *)&pcVar3->mount_point;
      uStack_3c = *(undefined4 *)((long)&pcVar3->mount_point + 4);
    }
    local_58 = 0;
    local_50 = 0;
    local_38 = 0x23;
    curious_call_callbacks(2,&local_58);
    sVar4 = (*UNRECOVERED_JUMPTABLE)(ptr,size,nmemb,stream);
    local_50 = 1;
    if (sVar4 != 0) {
      local_58 = sVar4 * size;
    }
    curious_call_callbacks(3,&local_58);
    *piVar1 = *piVar1 + -1;
    return sVar4;
  }
  *piVar1 = *piVar1 + -1;
  sVar4 = (*UNRECOVERED_JUMPTABLE)(ptr,size,nmemb,stream);
  return sVar4;
}

Assistant:

size_t wrapped_fwrite(void* ptr, size_t size, size_t nmemb, FILE* stream)
{
    WRAPPER_ENTER(fwrite);

    // Get the handle for the original function
    fwrite_f orig_fwrite = (fwrite_f) gotcha_get_wrappee(io_fns[CURIOUS_FWRITE_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fileno(stream));
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_FWRITE_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        size_t return_val  = orig_fwrite(ptr, size, nmemb, stream);
        io_args.call_count = 1;
        if (0 < return_val) {
            io_args.bytes_written = return_val * size;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fwrite);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fwrite(ptr, size, nmemb, stream), fwrite);
    }
}